

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-capnp.c++
# Opt level: O3

StringTree * __thiscall
capnp::anon_unknown_1::CapnpcCapnpMain::genParamList
          (StringTree *__return_storage_ptr__,CapnpcCapnpMain *this,InterfaceSchema interface,
          StructSchema schema,Reader brand,Method method)

{
  Reader type;
  Reader value;
  Reader value_00;
  Reader list;
  char *pcVar1;
  Branch *pBVar2;
  size_t sVar3;
  long lVar4;
  undefined8 uVar5;
  StructPointerCount SVar6;
  undefined8 uVar7;
  Schema SVar8;
  WirePointer *pWVar9;
  undefined8 uVar10;
  bool bVar11;
  int iVar12;
  StringTree *pSVar13;
  anon_union_8_2_eba6ea51_for_Type_5 params_1;
  RawBrandedSchema *pRVar14;
  ArrayPtr<const_char> *params;
  SegmentReader *pSVar15;
  StructReader *__return_storage_ptr___00;
  StringTree *pSVar16;
  uint uVar17;
  ulong uVar18;
  Reader RVar19;
  Type TVar20;
  Type type_00;
  StringPtr delim;
  StringTree local_448;
  StringTree *local_410;
  ulong local_408;
  Schema local_400;
  StringTree *local_3f8;
  StringTree *local_3f0;
  StringTree *local_3e8;
  ArrayDisposer *local_3e0;
  Array<kj::StringTree> local_3d8;
  char *local_3c0;
  undefined1 local_3b8 [40];
  size_t local_390;
  StringTree *pSStack_388;
  undefined8 *local_380;
  long local_378;
  StringTree *pSStack_370;
  undefined8 *local_368;
  StringTree local_360;
  StringTree local_328;
  Maybe<capnp::InterfaceSchema::Method> local_2f0;
  Field local_2a8;
  ArrayPtr<const_char> local_268;
  Schema local_258;
  ListReader LStack_250;
  StringTree local_220;
  RawBrandedSchema *local_1e8;
  uint local_1e0;
  undefined4 local_1dc;
  StructReader local_1d8;
  StringTree local_1a8;
  ListReader local_170;
  StructReader local_140;
  StructReader local_110;
  StructReader local_e0;
  FieldList local_b0;
  Maybe<capnp::InterfaceSchema::Method> local_78;
  
  local_410 = __return_storage_ptr__;
  local_400 = schema.super_Schema.raw;
  Schema::getProto((Reader *)&local_2f0,&local_400);
  if (((uint)local_2f0.ptr.field_1._24_4_ < 0xc0) ||
     (*(long *)(local_2f0.ptr.field_1._8_8_ + 0x10) == 0)) {
    StructSchema::getFields(&local_b0,(StructSchema *)&local_400);
    LStack_250.nestingLimit = local_b0.list.reader.nestingLimit;
    LStack_250._44_4_ = local_b0.list.reader._44_4_;
    LStack_250.elementCount = local_b0.list.reader.elementCount;
    LStack_250.step = local_b0.list.reader.step;
    LStack_250.structDataSize = local_b0.list.reader.structDataSize;
    LStack_250.structPointerCount = local_b0.list.reader.structPointerCount;
    LStack_250.elementSize = local_b0.list.reader.elementSize;
    LStack_250._39_1_ = local_b0.list.reader._39_1_;
    LStack_250.capTable = local_b0.list.reader.capTable;
    LStack_250.ptr = local_b0.list.reader.ptr;
    local_258 = local_b0.parent.super_Schema.raw;
    LStack_250.segment = local_b0.list.reader.segment;
    uVar18 = 0;
    pSVar13 = (StringTree *)0x0;
    local_3f0 = (StringTree *)
                kj::_::HeapArrayDisposer::allocateImpl
                          (0x38,0,local_b0.list.reader._24_8_ & 0xffffffff,
                           (_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    local_3e8 = local_3f0 + (local_b0.list.reader._24_8_ & 0xffffffff);
    local_3e0 = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    local_3f8 = local_3f0;
    if (LStack_250.elementCount != 0) {
      do {
        SVar8.raw = local_258.raw;
        local_408 = uVar18;
        _::ListReader::getStructElement(&local_1d8,&LStack_250,(ElementCount)uVar18);
        uVar10 = local_1d8._40_8_;
        pWVar9 = local_1d8.pointers;
        pRVar14 = (RawBrandedSchema *)local_1d8.capTable;
        pSVar15 = local_1d8.segment;
        local_1e8 = SVar8.raw;
        local_2a8.index = (uint)local_408;
        local_2a8.proto._reader.segment = local_1d8.segment;
        local_2a8.proto._reader.capTable = local_1d8.capTable;
        local_2a8.proto._reader.data = local_1d8.data;
        local_2a8.proto._reader.pointers = local_1d8.pointers;
        local_2a8.proto._reader.dataSize = local_1d8.dataSize;
        local_2a8.proto._reader.pointerCount = local_1d8.pointerCount;
        local_2a8.proto._reader._38_2_ = local_1d8._38_2_;
        uVar5 = local_2a8.proto._reader._32_8_;
        local_2a8.proto._reader.nestingLimit = local_1d8.nestingLimit;
        local_2a8.proto._reader._44_4_ = local_1d8._44_4_;
        uVar7 = local_2a8.proto._reader._40_8_;
        local_2a8.parent.super_Schema.raw = (Schema)(Schema)SVar8.raw;
        local_2a8._12_4_ = local_1dc;
        local_2a8.proto._reader.pointerCount = local_1d8.pointerCount;
        SVar6 = local_2a8.proto._reader.pointerCount;
        local_2a8.proto._reader.nestingLimit = local_1d8.nestingLimit;
        iVar12 = local_2a8.proto._reader.nestingLimit;
        local_2f0.ptr.field_1.value.parent.super_Schema.raw = (InterfaceSchema)local_1d8.capTable;
        local_2f0.ptr.field_1._8_8_ = local_1d8.pointers;
        local_2f0.ptr._0_8_ = local_1d8.segment;
        if (local_2a8.proto._reader.pointerCount == 0) {
          local_2a8.proto._reader.nestingLimit = 0x7fffffff;
          local_2f0.ptr.field_1.value.parent.super_Schema.raw =
               (InterfaceSchema)(RawBrandedSchema *)0x0;
          local_2f0.ptr.field_1._8_8_ = (WirePointer *)0x0;
          local_2f0.ptr._0_8_ = (SegmentReader *)0x0;
        }
        local_2f0.ptr.field_1._16_4_ = local_2a8.proto._reader.nestingLimit;
        local_2a8.proto._reader._32_8_ = uVar5;
        local_2a8.proto._reader._40_8_ = uVar7;
        local_1e0 = local_2a8.index;
        RVar19 = _::PointerReader::getBlob<capnp::Text>((PointerReader *)&local_2f0,(void *)0x0,0);
        local_3c0 = RVar19.super_StringPtr.content.ptr;
        if (SVar6 < 3) {
          local_2f0.ptr.field_1._16_4_ = 0x7fffffff;
          local_2f0.ptr.field_1.value.parent.super_Schema.raw =
               (InterfaceSchema)(RawBrandedSchema *)0x0;
          local_2f0.ptr.field_1._8_8_ = (WirePointer *)0x0;
          local_2f0.ptr._0_8_ = (SegmentReader *)0x0;
        }
        else {
          local_2f0.ptr.field_1._8_8_ = pWVar9 + 2;
          local_2f0.ptr.field_1.value.parent.super_Schema.raw = (InterfaceSchema)pRVar14;
          local_2f0.ptr._0_8_ = pSVar15;
          local_2f0.ptr.field_1._16_4_ = iVar12;
        }
        _::PointerReader::getStruct(&local_e0,(PointerReader *)&local_2f0,(word *)0x0);
        local_2f0.ptr._0_8_ = local_2f0.ptr._0_8_ & 0xffffffffffffff00;
        type._reader.capTable = local_e0.capTable;
        type._reader.segment = local_e0.segment;
        type._reader.data = local_e0.data;
        type._reader.pointers = local_e0.pointers;
        type._reader.dataSize = local_e0.dataSize;
        type._reader.pointerCount = local_e0.pointerCount;
        type._reader._38_2_ = local_e0._38_2_;
        type._reader.nestingLimit = local_e0.nestingLimit;
        type._reader._44_4_ = local_e0._44_4_;
        genType(&local_328,this,type,interface.super_Schema.raw,&local_2f0);
        if (SVar6 < 4) {
          local_448.text.content.disposer._0_4_ = 0x7fffffff;
          local_448.text.content.ptr = (char *)0x0;
          local_448.text.content.size_ = 0;
          local_448.size_ = 0;
        }
        else {
          local_448.text.content.size_ = (size_t)(pWVar9 + 3);
          local_448.text.content.ptr = (char *)pRVar14;
          local_448.size_ = (size_t)pSVar15;
          local_448.text.content.disposer._0_4_ = iVar12;
        }
        __return_storage_ptr___00 = &local_110;
        _::PointerReader::getStruct
                  (__return_storage_ptr___00,(PointerReader *)&local_448,(word *)0x0);
        value._reader.capTable = local_110.capTable;
        value._reader.segment = local_110.segment;
        value._reader.data = local_110.data;
        value._reader.pointers = local_110.pointers;
        value._reader.dataSize = local_110.dataSize;
        value._reader.pointerCount = local_110.pointerCount;
        value._reader._38_2_ = local_110._38_2_;
        value._reader.nestingLimit = local_110.nestingLimit;
        value._reader._44_4_ = local_110._44_4_;
        bVar11 = isEmptyValue((CapnpcCapnpMain *)__return_storage_ptr___00,value);
        if (bVar11) {
          local_448.size_ = 0x1a3e9e;
          local_448.text.content.ptr = (char *)0x0;
          kj::StringTree::concat<kj::ArrayPtr<char_const>>
                    ((StringTree *)(local_3b8 + 0x20),&local_448,params);
        }
        else {
          TVar20 = StructSchema::Field::getType(&local_2a8);
          type_00._0_8_ = TVar20.field_4;
          if (SVar6 < 4) {
            params_1.scopeId = 0x7fffffff;
            local_448.text.content.ptr = (char *)0x0;
            local_448.text.content.size_ = 0;
            local_448.size_ = 0;
          }
          else {
            local_448.text.content.size_ = (size_t)(pWVar9 + 3);
            params_1.scopeId = uVar10 & 0xffffffff;
            local_448.text.content.ptr = (char *)pRVar14;
            local_448.size_ = (size_t)pSVar15;
          }
          local_448.text.content.disposer._0_4_ = (int)params_1.scopeId;
          _::PointerReader::getStruct(&local_140,(PointerReader *)&local_448,(word *)0x0);
          value_00._reader.capTable = local_140.capTable;
          value_00._reader.segment = local_140.segment;
          value_00._reader.data = local_140.data;
          value_00._reader.pointers = local_140.pointers;
          value_00._reader.dataSize = local_140.dataSize;
          value_00._reader.pointerCount = local_140.pointerCount;
          value_00._reader._38_2_ = local_140._38_2_;
          value_00._reader.nestingLimit = local_140.nestingLimit;
          value_00._reader._44_4_ = local_140._44_4_;
          type_00.field_4.schema = params_1.schema;
          genValue(&local_360,TVar20._0_8_,type_00,value_00);
          local_448.size_ = 0x193923;
          local_448.text.content.ptr = (char *)0x3;
          kj::StringTree::concat<kj::ArrayPtr<char_const>,kj::StringTree>
                    ((StringTree *)(local_3b8 + 0x20),&local_448,(ArrayPtr<const_char> *)&local_360,
                     (StringTree *)params_1.schema);
        }
        if (SVar6 < 2) {
          iVar12 = 0x7fffffff;
          pRVar14 = (RawBrandedSchema *)0x0;
          local_3b8._16_8_ = (WirePointer *)0x0;
          pSVar15 = (SegmentReader *)0x0;
        }
        else {
          local_3b8._16_8_ = pWVar9 + 1;
        }
        local_3b8._0_8_ = pSVar15;
        local_3b8._8_8_ = pRVar14;
        local_3b8._24_4_ = iVar12;
        _::PointerReader::getList
                  (&local_170,(PointerReader *)local_3b8,INLINE_COMPOSITE,(word *)0x0);
        list.reader.capTable = local_170.capTable;
        list.reader.segment = local_170.segment;
        list.reader.ptr = local_170.ptr;
        list.reader.elementCount = local_170.elementCount;
        list.reader.step = local_170.step;
        list.reader.structDataSize = local_170.structDataSize;
        list.reader.structPointerCount = local_170.structPointerCount;
        list.reader.elementSize = local_170.elementSize;
        list.reader._39_1_ = local_170._39_1_;
        list.reader.nestingLimit = local_170.nestingLimit;
        list.reader._44_4_ = local_170._44_4_;
        pSVar16 = (StringTree *)local_170.segment;
        genAnnotations(&local_448,this,list,interface.super_Schema.raw);
        local_3b8._8_8_ = RVar19.super_StringPtr.content.size_ - 1;
        local_3b8._0_8_ = local_3c0;
        local_268.ptr = " :";
        local_268.size_ = 2;
        pSVar13 = (StringTree *)(local_3b8 + 0x20);
        kj::StringTree::
        concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::StringTree>
                  (&local_220,(StringTree *)local_3b8,&local_268,(ArrayPtr<const_char> *)&local_328,
                   pSVar13,&local_448,pSVar16);
        uVar18 = local_408;
        pSVar16 = (StringTree *)local_448.branches.size_;
        pBVar2 = local_448.branches.ptr;
        if (local_448.branches.ptr != (Branch *)0x0) {
          local_448.branches.ptr = (Branch *)0x0;
          local_448.branches.size_ = 0;
          (*(code *)**(undefined8 **)local_448.branches.disposer)
                    (local_448.branches.disposer,pBVar2,0x40,pSVar16,pSVar16,
                     kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
          pSVar13 = pSVar16;
        }
        pSVar16 = (StringTree *)local_448.text.content.size_;
        pcVar1 = local_448.text.content.ptr;
        if (local_448.text.content.ptr != (char *)0x0) {
          local_448.text.content.ptr = (char *)0x0;
          local_448.text.content.size_ = 0;
          (*(code *)**(undefined8 **)
                      CONCAT44(local_448.text.content.disposer._4_4_,
                               (int)local_448.text.content.disposer))
                    ((undefined8 *)
                     CONCAT44(local_448.text.content.disposer._4_4_,
                              (int)local_448.text.content.disposer),pcVar1,1,pSVar16,pSVar16,0);
          pSVar13 = pSVar16;
        }
        pSVar16 = pSStack_370;
        lVar4 = local_378;
        if (local_378 != 0) {
          local_378 = 0;
          pSStack_370 = (StringTree *)0x0;
          (**(code **)*local_368)
                    (local_368,lVar4,0x40,pSVar16,pSVar16,
                     kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
          pSVar13 = pSVar16;
        }
        pSVar16 = pSStack_388;
        sVar3 = local_390;
        if (local_390 != 0) {
          local_390 = 0;
          pSStack_388 = (StringTree *)0x0;
          (**(code **)*local_380)(local_380,sVar3,1,pSVar16,pSVar16,0);
          pSVar13 = pSVar16;
        }
        pSVar16 = (StringTree *)local_360.branches.size_;
        pBVar2 = local_360.branches.ptr;
        if (!bVar11) {
          if (local_360.branches.ptr != (Branch *)0x0) {
            local_360.branches.ptr = (Branch *)0x0;
            local_360.branches.size_ = 0;
            (*(code *)**(undefined8 **)local_360.branches.disposer)
                      (local_360.branches.disposer,pBVar2,0x40,pSVar16,pSVar16,
                       kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
            pSVar13 = pSVar16;
          }
          pSVar16 = (StringTree *)local_360.text.content.size_;
          pcVar1 = local_360.text.content.ptr;
          if (local_360.text.content.ptr != (char *)0x0) {
            local_360.text.content.ptr = (char *)0x0;
            local_360.text.content.size_ = 0;
            (*(code *)**(undefined8 **)local_360.text.content.disposer)
                      (local_360.text.content.disposer,pcVar1,1,pSVar16,pSVar16,0);
            pSVar13 = pSVar16;
          }
        }
        pSVar16 = (StringTree *)local_328.branches.size_;
        pBVar2 = local_328.branches.ptr;
        if (local_328.branches.ptr != (Branch *)0x0) {
          local_328.branches.ptr = (Branch *)0x0;
          local_328.branches.size_ = 0;
          (*(code *)**(undefined8 **)local_328.branches.disposer)
                    (local_328.branches.disposer,pBVar2,0x40,pSVar16,pSVar16,
                     kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
          pSVar13 = pSVar16;
        }
        pSVar16 = (StringTree *)local_328.text.content.size_;
        pcVar1 = local_328.text.content.ptr;
        if (local_328.text.content.ptr != (char *)0x0) {
          local_328.text.content.ptr = (char *)0x0;
          local_328.text.content.size_ = 0;
          (*(code *)**(undefined8 **)local_328.text.content.disposer)
                    (local_328.text.content.disposer,pcVar1,1,pSVar16,pSVar16,0);
          pSVar13 = pSVar16;
        }
        local_3f0->size_ = local_220.size_;
        (local_3f0->text).content.ptr = local_220.text.content.ptr;
        (local_3f0->text).content.size_ = local_220.text.content.size_;
        local_220.text.content.ptr = (char *)0x0;
        local_220.text.content.size_ = 0;
        (local_3f0->text).content.disposer = local_220.text.content.disposer;
        (local_3f0->branches).ptr = local_220.branches.ptr;
        (local_3f0->branches).size_ = local_220.branches.size_;
        (local_3f0->branches).disposer = local_220.branches.disposer;
        local_3f0 = local_3f0 + 1;
        uVar17 = (int)uVar18 + 1;
        uVar18 = (ulong)uVar17;
      } while (uVar17 != LStack_250.elementCount);
    }
    local_3d8.size_ = ((long)local_3f0 - (long)local_3f8 >> 3) * 0x6db6db6db6db6db7;
    delim.content.size_ = 3;
    delim.content.ptr = ", ";
    local_3d8.ptr = local_3f8;
    local_3d8.disposer = local_3e0;
    kj::StringTree::StringTree(&local_1a8,&local_3d8,delim);
    pSVar13 = kj::strTree<char_const(&)[2],kj::StringTree,char_const(&)[2]>
                        (local_410,(kj *)0x1938a9,(char (*) [2])&local_1a8,(StringTree *)0x19f9a3,
                         (char (*) [2])pSVar13);
    sVar3 = local_1a8.branches.size_;
    pBVar2 = local_1a8.branches.ptr;
    if (local_1a8.branches.ptr != (Branch *)0x0) {
      local_1a8.branches.ptr = (Branch *)0x0;
      local_1a8.branches.size_ = 0;
      pSVar13 = (StringTree *)
                (*(code *)**(undefined8 **)local_1a8.branches.disposer)
                          (local_1a8.branches.disposer,pBVar2,0x40,sVar3,sVar3,
                           kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    }
    sVar3 = local_1a8.text.content.size_;
    pcVar1 = local_1a8.text.content.ptr;
    if (local_1a8.text.content.ptr != (char *)0x0) {
      local_1a8.text.content.ptr = (char *)0x0;
      local_1a8.text.content.size_ = 0;
      pSVar13 = (StringTree *)
                (*(code *)**(undefined8 **)local_1a8.text.content.disposer)
                          (local_1a8.text.content.disposer,pcVar1,1,sVar3,sVar3,0);
    }
    sVar3 = local_3d8.size_;
    pSVar16 = local_3d8.ptr;
    if (local_3d8.ptr != (StringTree *)0x0) {
      local_3d8.ptr = (StringTree *)0x0;
      local_3d8.size_ = 0;
      pSVar13 = (StringTree *)
                (*(code *)**(undefined8 **)local_3d8.disposer)
                          (local_3d8.disposer,pSVar16,0x38,sVar3,sVar3,
                           kj::ArrayDisposer::Dispose_<kj::StringTree,_false>::destruct);
    }
  }
  else {
    local_78.ptr.isSet = true;
    local_78.ptr.field_1.value.parent.super_Schema.raw =
         (InterfaceSchema)(InterfaceSchema)method.parent.super_Schema.raw;
    local_78.ptr.field_1._8_8_ = method._8_8_;
    local_78.ptr.field_1.value.proto._reader.segment = method.proto._reader.segment;
    local_78.ptr.field_1.value.proto._reader.capTable = method.proto._reader.capTable;
    local_78.ptr.field_1.value.proto._reader.data = method.proto._reader.data;
    local_78.ptr.field_1.value.proto._reader.pointers = method.proto._reader.pointers;
    local_78.ptr.field_1.value.proto._reader.dataSize = method.proto._reader.dataSize;
    local_78.ptr.field_1.value.proto._reader.pointerCount = method.proto._reader.pointerCount;
    local_78.ptr.field_1._54_2_ = method.proto._reader._38_2_;
    local_78.ptr.field_1._56_8_ = method.proto._reader._40_8_;
    pSVar13 = nodeName(local_410,this,local_400,interface.super_Schema.raw,brand,&local_78);
  }
  return pSVar13;
}

Assistant:

kj::StringTree genParamList(InterfaceSchema interface, StructSchema schema,
                              schema::Brand::Reader brand, InterfaceSchema::Method method) {
    if (schema.getProto().getScopeId() == 0) {
      // A named parameter list.
      return kj::strTree("(", kj::StringTree(
          KJ_MAP(field, schema.getFields()) {
            auto proto = field.getProto();
            auto slot = proto.getSlot();

            return kj::strTree(
                proto.getName(), " :", genType(slot.getType(), interface, nullptr),
                isEmptyValue(slot.getDefaultValue()) ? kj::strTree("") :
                    kj::strTree(" = ", genValue(field.getType(), slot.getDefaultValue())),
                genAnnotations(proto.getAnnotations(), interface));
          }, ", "), ")");
    } else {
      return nodeName(schema, interface, brand, method);
    }
  }